

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object __thiscall Am_Object::Copy(Am_Object *this,char *new_name)

{
  Am_Object_Data *pAVar1;
  Am_Constraint_Context *new_cc;
  char *in_RDX;
  Am_Constraint_Context *old_cc;
  char *new_name_local;
  Am_Object *this_local;
  Am_Object *new_object;
  
  if (*(long *)new_name == 0) {
    Am_Object(this,&Am_Root_Object);
  }
  else {
    if ((*(ushort *)(*(long *)new_name + 0x4c) & 0x8000) != 0) {
      Am_Demon_Queue::Invoke((Am_Demon_Queue *)(*(long *)new_name + 0x40));
    }
    Am_Object(this);
    pAVar1 = Am_Object_Data::copy_object(*(Am_Object_Data **)new_name,in_RDX);
    this->data = pAVar1;
    Am_Demon_Queue::Prevent_Invoke(&this->data->demon_queue);
    new_cc = Am_Object_Advanced::Swap_Context(Am_Empty_Constraint_Context);
    Am_Object_Data::invoke_copy_demons(this->data);
    Am_Object_Advanced::Swap_Context(new_cc);
    Am_Demon_Queue::Release_Invoke(&this->data->demon_queue);
    Am_Object_Data::validate_object(this->data);
    Am_Object_Data::note_parts(this->data);
  }
  return (Am_Object)(Am_Object_Data *)this;
}

Assistant:

Am_Object
Am_Object::Copy(const char *new_name) const
{
  if (data) {
    if (data->demons_active & DEMONS_ACTIVE)
      data->demon_queue.Invoke();
    Am_Object new_object;
    new_object.data = data->copy_object(new_name);
    new_object.data->demon_queue.Prevent_Invoke();
    Am_PUSH_EMPTY_CC() new_object.data->invoke_copy_demons();
    Am_POP_EMPTY_CC() new_object.data->demon_queue.Release_Invoke();
    new_object.data->validate_object();
    new_object.data->note_parts();
#ifdef DEBUG
    Global_Call_Object_Trace(*this, new_object, Am_TRACE_OBJECT_COPIED);
#endif
    return new_object;
  } else
    return Am_Root_Object;
}